

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::allTerminal
          (CycleBreaking<covenant::Sym> *this,const_iterator Begin,const_iterator End,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  bool bVar1;
  Sym *in_RCX;
  __normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  in_RSI;
  CycleBreaking<covenant::Sym> *in_RDI;
  const_iterator I;
  CycleBreaking<covenant::Sym> *this_00;
  
  this_00 = in_RDI;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                        *)in_RSI._M_current,
                       (__normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
    ::operator*((__normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                 *)&stack0xffffffffffffffd0);
    bVar1 = isTerminal(this_00,in_RCX,
                       (set<int,_std::less<int>,_std::allocator<int>_> *)in_RSI._M_current);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
    ::operator++((__normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                  *)&stack0xffffffffffffffd0);
  }
  return false;
}

Assistant:

bool allTerminal (typename vector<EdgeSym>::const_iterator Begin, 
                    typename vector<EdgeSym>::const_iterator End, 
                    const set<int> &scc)
  {
    for (typename vector<EdgeSym>::const_iterator I = Begin; I != End; ++I)
    {
      if (!isTerminal(*I,scc)) return false;
    }
    return true;
  }